

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool absl::lts_20240722::debugging_internal::ParseTemplateArgs(State *state)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  
  iVar5 = state->recursion_depth;
  iVar1 = state->steps;
  state->recursion_depth = iVar5 + 1;
  state->steps = iVar1 + 1;
  if (0x1ffff < iVar1 || 0xff < iVar5) {
    bVar4 = false;
    goto LAB_00102ffe;
  }
  iVar5 = (state->parse_state).prev_name_idx;
  iVar1 = (state->parse_state).mangled_idx;
  iVar3 = (state->parse_state).out_cur_idx;
  uVar2 = *(uint *)&(state->parse_state).field_0xc;
  *(uint *)&(state->parse_state).field_0xc = uVar2 & 0x7fffffff;
  bVar4 = ParseOneCharToken(state,'I');
  if (bVar4) {
    bVar4 = OneOrMore(ParseTemplateArg,state);
    if (!bVar4) goto LAB_00102fe1;
    ParseQRequiresClauseExpr(state);
    bVar4 = ParseOneCharToken(state,'E');
    if (!bVar4) goto LAB_00102fe1;
    *(uint *)&(state->parse_state).field_0xc =
         *(uint *)&(state->parse_state).field_0xc & 0x7fffffff | uVar2 & 0x80000000;
    MaybeAppend(state,"<>");
    bVar4 = true;
  }
  else {
LAB_00102fe1:
    (state->parse_state).prev_name_idx = iVar5;
    (state->parse_state).mangled_idx = iVar1;
    (state->parse_state).out_cur_idx = iVar3;
    *(uint *)&(state->parse_state).field_0xc = uVar2;
    bVar4 = false;
  }
  iVar5 = state->recursion_depth + -1;
LAB_00102ffe:
  state->recursion_depth = iVar5;
  return bVar4;
}

Assistant:

static bool ParseTemplateArgs(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;
  DisableAppend(state);
  if (ParseOneCharToken(state, 'I') && OneOrMore(ParseTemplateArg, state) &&
      Optional(ParseQRequiresClauseExpr(state)) &&
      ParseOneCharToken(state, 'E')) {
    RestoreAppend(state, copy.append);
    MaybeAppend(state, "<>");
    return true;
  }
  state->parse_state = copy;
  return false;
}